

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptLibrary.cpp
# Opt level: O2

JavascriptMap * __thiscall Js::JavascriptLibrary::CreateMap(JavascriptLibrary *this)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  Recycler *alloc;
  JavascriptMap *this_00;
  undefined1 local_40 [8];
  TrackAllocData data;
  
  if ((this->mapType).ptr == (DynamicType *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptLibrary.cpp"
                                ,0x180d,"(mapType)","Where\'s mapType?");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
  }
  local_40 = (undefined1  [8])&JavascriptMap::typeinfo;
  data.typeinfo = (type_info *)0x0;
  data.plusSize = 0xffffffffffffffff;
  data.count = (size_t)anon_var_dwarf_74a5554;
  data.filename._0_4_ = 0x180e;
  alloc = Memory::Recycler::TrackAllocInfo(this->recycler,(TrackAllocData *)local_40);
  this_00 = (JavascriptMap *)new<Memory::Recycler>(0x40,alloc,0x37a1d4);
  JavascriptMap::JavascriptMap(this_00,(this->mapType).ptr);
  return this_00;
}

Assistant:

JavascriptMap* JavascriptLibrary::CreateMap()
    {
        AssertMsg(mapType, "Where's mapType?");
        return RecyclerNew(this->GetRecycler(), JavascriptMap, mapType);
    }